

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

void helics::BrokerFactory::unregisterBroker(string_view name)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  string local_68;
  undefined1 local_48 [16];
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,in_RSI,in_RDI + in_RSI);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::removeObject
                    ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,
                     &local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) {
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = local_48;
    pcStack_20 = std::
                 _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:341:13)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:341:13)>
               ::_M_manager;
    gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::removeObject
              ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,
               (function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
    }
  }
  return;
}

Assistant:

void unregisterBroker(std::string_view name)
{
    if (!searchableBrokers.removeObject(std::string(name))) {
        searchableBrokers.removeObject(
            [&name](auto& obj) { return (obj->getIdentifier() == name); });
    }
}